

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O1

void fe4_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long_long t;
  ulong uVar8;
  
  uVar8 = *arg1 + *arg2;
  uVar1 = (ulong)CARRY8(*arg1,*arg2);
  uVar3 = arg1[1] + arg2[1];
  uVar4 = uVar3 + uVar1;
  uVar1 = (ulong)(CARRY8(arg1[1],arg2[1]) || CARRY8(uVar3,uVar1));
  uVar3 = arg1[2] + arg2[2];
  uVar7 = uVar3 + uVar1;
  uVar1 = (ulong)(CARRY8(arg1[2],arg2[2]) || CARRY8(uVar3,uVar1));
  uVar3 = arg1[3] + arg2[3];
  uVar6 = uVar3 + uVar1;
  uVar5 = (ulong)(-(uint)(CARRY8(arg1[3],arg2[3]) || CARRY8(uVar3,uVar1)) & 0x26);
  uVar1 = (ulong)CARRY8(uVar5,uVar8);
  uVar3 = (ulong)CARRY8(uVar4,uVar1);
  uVar2 = (ulong)CARRY8(uVar7,uVar3);
  *out1 = (ulong)(-(uint)CARRY8(uVar6,uVar2) & 0x26) + uVar5 + uVar8;
  out1[1] = uVar4 + uVar1;
  out1[2] = uVar7 + uVar3;
  out1[3] = uVar6 + uVar2;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_add(uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
  uint64_t x1;
  fiat_uint1 x2;
  uint64_t x3;
  fiat_uint1 x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  fiat_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  fiat_uint1 x11;
  uint64_t x12;
  fiat_uint1 x13;
  uint64_t x14;
  fiat_uint1 x15;
  uint64_t x16;
  fiat_uint1 x17;
  uint64_t x18;
  uint64_t x19;
  fiat_uint1 x20;
  fiat_addcarryx_u64(&x1, &x2, 0x0, (arg1[0]), (arg2[0]));
  fiat_addcarryx_u64(&x3, &x4, x2, (arg1[1]), (arg2[1]));
  fiat_addcarryx_u64(&x5, &x6, x4, (arg1[2]), (arg2[2]));
  fiat_addcarryx_u64(&x7, &x8, x6, (arg1[3]), (arg2[3]));
  fiat_cmovznz_u64(&x9, x8, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_addcarryx_u64(&x10, &x11, 0x0, x1, x9);
  fiat_addcarryx_u64(&x12, &x13, x11, x3, 0x0);
  fiat_addcarryx_u64(&x14, &x15, x13, x5, 0x0);
  fiat_addcarryx_u64(&x16, &x17, x15, x7, 0x0);
  fiat_cmovznz_u64(&x18, x17, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_addcarryx_u64(&x19, &x20, 0x0, x10, x18);
  out1[0] = x19;
  out1[1] = x12;
  out1[2] = x14;
  out1[3] = x16;
}